

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImWchar FindFirstExistingGlyph(ImFont *font,ImWchar *candidate_chars,int candidate_chars_count)

{
  ImFontGlyph *pIVar1;
  int in_EDX;
  long in_RSI;
  ImFont *in_RDI;
  int n;
  int local_20;
  
  local_20 = 0;
  while( true ) {
    if (in_EDX <= local_20) {
      return 0xffff;
    }
    pIVar1 = ImFont::FindGlyphNoFallback(in_RDI,*(ImWchar *)(in_RSI + (long)local_20 * 2));
    if (pIVar1 != (ImFontGlyph *)0x0) break;
    local_20 = local_20 + 1;
  }
  return *(ImWchar *)(in_RSI + (long)local_20 * 2);
}

Assistant:

static ImWchar FindFirstExistingGlyph(ImFont* font, const ImWchar* candidate_chars, int candidate_chars_count)
{
    for (int n = 0; n < candidate_chars_count; n++)
        if (font->FindGlyphNoFallback(candidate_chars[n]) != NULL)
            return candidate_chars[n];
    return (ImWchar)-1;
}